

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMergingMethods
          (MessageGenerator *this,Printer *printer)

{
  long lVar1;
  mapped_type *pmVar2;
  FieldGeneratorBase *pFVar3;
  Descriptor *pDVar4;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *descriptor;
  FieldDescriptor *extraout_RDX_00;
  long lVar5;
  csharp *this_00;
  long lVar6;
  long lVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  key_type local_a8;
  string local_88;
  long local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  lVar5 = **(long **)(this->descriptor_ + 8);
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,lVar5,(*(long **)(this->descriptor_ + 8))[1] + lVar5);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"class_name","");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,&local_a8);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_60,"public void MergeFrom($class_name$ other) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"if (other == null) {\n  return;\n}\n");
  pDVar4 = this->descriptor_;
  if (0 < *(int *)(pDVar4 + 4)) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      lVar7 = *(long *)(pDVar4 + 0x28);
      if ((((*(byte *)(lVar7 + 1 + lVar6) & 0x10) == 0) ||
          (lVar1 = *(long *)(lVar7 + 0x28 + lVar6), lVar1 == 0)) ||
         ((*(int *)(lVar1 + 4) == 1 &&
          (((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0 || (lVar1 == 0)))))) {
        pFVar3 = CreateFieldGeneratorInternal(this,(FieldDescriptor *)(lVar7 + lVar6));
        (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[7])(pFVar3,printer);
        (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar3);
      }
      lVar5 = lVar5 + 1;
      pDVar4 = this->descriptor_;
      lVar6 = lVar6 + 0x48;
    } while (lVar5 < *(int *)(pDVar4 + 4));
  }
  pDVar4 = this->descriptor_;
  if (0 < *(int *)(pDVar4 + 0x6c)) {
    lVar5 = 0;
    do {
      lVar6 = *(long *)(pDVar4 + 0x30);
      UnderscoresToCamelCase(&local_88,*(string **)(lVar6 + 8 + lVar5 * 0x28),false,false);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"name","");
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_60,&local_a8);
      std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      lVar6 = lVar6 + lVar5 * 0x28;
      UnderscoresToCamelCase(&local_88,*(string **)(lVar6 + 8),true,false);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"property_name","");
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_60,&local_a8);
      std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      local_68 = lVar5;
      io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_60,"switch (other.$property_name$Case) {\n");
      io::Printer::Indent(printer);
      if (0 < *(int *)(lVar6 + 4)) {
        lVar5 = 0;
        lVar7 = 0;
        descriptor = extraout_RDX;
        do {
          this_00 = (csharp *)(*(long *)(lVar6 + 0x20) + lVar5);
          GetPropertyName_abi_cxx11_(&local_88,this_00,descriptor);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"field_property_name","");
          pmVar2 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_60,&local_a8);
          std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&local_60,
                             "case $property_name$OneofCase.$field_property_name$:\n");
          io::Printer::Indent(printer);
          pFVar3 = CreateFieldGeneratorInternal(this,(FieldDescriptor *)this_00);
          (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[7])(pFVar3,printer);
          io::Printer::Print<>(printer,"break;\n");
          io::Printer::Outdent(printer);
          (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar3);
          lVar7 = lVar7 + 1;
          lVar5 = lVar5 + 0x48;
          descriptor = extraout_RDX_00;
        } while (lVar7 < *(int *)(lVar6 + 4));
      }
      io::Printer::Outdent(printer);
      io::Printer::Print<>(printer,"}\n\n");
      lVar5 = local_68 + 1;
      pDVar4 = this->descriptor_;
    } while (lVar5 < *(int *)(pDVar4 + 0x6c));
  }
  if (this->has_extension_ranges_ != false) {
    io::Printer::Print<>
              (printer,"pb::ExtensionSet.MergeFrom(ref _extensions, other._extensions);\n");
  }
  io::Printer::Print<>
            (printer,
             "_unknownFields = pb::UnknownFieldSet.MergeFrom(_unknownFields, other._unknownFields);\n"
            );
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print<>(printer,"public void MergeFrom(pb::CodedInputStream input) {\n");
  io::Printer::Print<>(printer,"#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"input.ReadRawMessage(this);\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"#else\n");
  io::Printer::Indent(printer);
  GenerateMainParseLoop(this,printer,false);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"#endif\n");
  io::Printer::Print<>(printer,"}\n\n");
  io::Printer::Print<>(printer,"#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print<>
            (printer,"void pb::IBufferMessage.InternalMergeFrom(ref pb::ParseContext input) {\n");
  io::Printer::Indent(printer);
  GenerateMainParseLoop(this,printer,true);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  io::Printer::Print<>(printer,"#endif\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void MessageGenerator::GenerateMergingMethods(io::Printer* printer) {
  // Note:  These are separate from GenerateMessageSerializationMethods()
  //   because they need to be generated even for messages that are optimized
  //   for code size.
  std::map<std::string, std::string> vars;
  vars["class_name"] = class_name();

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "public void MergeFrom($class_name$ other) {\n");
  printer->Indent();
  printer->Print(
    "if (other == null) {\n"
    "  return;\n"
    "}\n");
  // Merge non-oneof fields, treating optional proto3 fields as normal fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->real_containing_oneof()) {
      continue;
    }
    std::unique_ptr<FieldGeneratorBase> generator(CreateFieldGeneratorInternal(field));
    generator->GenerateMergingCode(printer);
  }
  // Merge oneof fields (for non-synthetic oneofs)
  for (int i = 0; i < descriptor_->real_oneof_decl_count(); ++i) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    vars["name"] = UnderscoresToCamelCase(oneof->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(oneof->name(), true);
    printer->Print(vars, "switch (other.$property_name$Case) {\n");
    printer->Indent();
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      vars["field_property_name"] = GetPropertyName(field);
      printer->Print(
        vars,
        "case $property_name$OneofCase.$field_property_name$:\n");
      printer->Indent();
      std::unique_ptr<FieldGeneratorBase> generator(CreateFieldGeneratorInternal(field));
      generator->GenerateMergingCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }
  // Merge extensions
  if (has_extension_ranges_) {
    printer->Print("pb::ExtensionSet.MergeFrom(ref _extensions, other._extensions);\n");
  }

  // Merge unknown fields.
  printer->Print(
      "_unknownFields = pb::UnknownFieldSet.MergeFrom(_unknownFields, other._unknownFields);\n");

  printer->Outdent();
  printer->Print("}\n\n");

  WriteGeneratedCodeAttributes(printer);
  printer->Print("public void MergeFrom(pb::CodedInputStream input) {\n");
  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  printer->Indent();
  printer->Print("input.ReadRawMessage(this);\n");
  printer->Outdent();
  printer->Print("#else\n");
  printer->Indent();
  GenerateMainParseLoop(printer, false);
  printer->Outdent();
  printer->Print("#endif\n");
  printer->Print("}\n\n");

  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print("void pb::IBufferMessage.InternalMergeFrom(ref pb::ParseContext input) {\n");
  printer->Indent();
  GenerateMainParseLoop(printer, true);
  printer->Outdent();
  printer->Print("}\n"); // method
  printer->Print("#endif\n\n");

}